

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Response.cpp
# Opt level: O0

object get_status(SRUP_MSG_RESPONSE *self)

{
  uint8_t *x;
  SRUP_MSG_RESPONSE *in_RSI;
  uint8_t *rv;
  SRUP_MSG_RESPONSE *self_local;
  
  x = SRUP_MSG_RESPONSE::status(in_RSI);
  if (x == (uint8_t *)0x0) {
    boost::python::api::object::object((object *)self);
  }
  else {
    boost::python::api::object::object<unsigned_char>((object *)self,x);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_status(SRUP_MSG_RESPONSE& self)
{
        const uint8_t* rv;
        rv = self.status();

        if (rv != nullptr)
            return boost::python::object(*rv);
        else
            return boost::python::object();
}